

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O3

_Bool randcalc_valid(random_value v,int test)

{
  int dmg;
  
  if (test < v.dice + v.base) {
    return false;
  }
  return test <= (v._10_4_ >> 0x10) + v.base + v.dice * v.sides;
}

Assistant:

bool randcalc_valid(random_value v, int test)
{
	if (test < randcalc(v, 0, MINIMISE))
		return false;
	else if (test > randcalc(v, 0, MAXIMISE))
		return false;
	else
		return true;
}